

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tria_o2.cc
# Opt level: O0

MatrixXd * __thiscall
lf::geometry::TriaO2::JacobianInverseGramian
          (MatrixXd *__return_storage_ptr__,TriaO2 *this,MatrixXd *local)

{
  Index *this_00;
  bool bVar1;
  int iVar2;
  runtime_error *this_01;
  Index IVar3;
  Scalar *pSVar4;
  CommaInitializer<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_> *pCVar5;
  Index IVar6;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pCVar7;
  bool local_611;
  Type local_610;
  Scalar local_5d8;
  Product<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
  local_5d0;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Product<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_590;
  ReturnType local_530;
  Scalar local_528;
  Scalar local_520;
  ReturnType local_518;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_510;
  int local_4f0 [2];
  undefined1 local_4e8 [8];
  MatrixXd tmp;
  ReturnType AB;
  ColXpr B;
  ColXpr A;
  Type jacobian_1;
  long i_1;
  Scalar local_380;
  Scalar local_378;
  Scalar local_370;
  Type local_368;
  CommaInitializer<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_> local_330
  ;
  undefined1 local_310 [8];
  Type jacobian;
  long i;
  Index local_2c8;
  undefined1 local_2b9;
  undefined1 local_2b8 [8];
  MatrixXd jac;
  allocator<char> local_279;
  string local_278;
  allocator<char> local_251;
  string local_250;
  stringstream local_220 [8];
  stringstream ss;
  ostream local_210 [376];
  Scalar local_98;
  NestedExpressionType local_90;
  CmpLEReturnType local_88;
  NestedExpressionType local_60;
  Scalar local_58;
  RCmpLEReturnType local_50;
  MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *local_20;
  MatrixXd *local_local;
  TriaO2 *this_local;
  MatrixXd *jacInvGram;
  
  local_58 = 0.0;
  local_20 = (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local;
  local_local = (MatrixXd *)this;
  this_local = (TriaO2 *)__return_storage_ptr__;
  local_60 = (NestedExpressionType)
             Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::array
                       ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local);
  Eigen::operator<=(&local_50,&local_58,
                    (ArrayBase<Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                     *)&local_60);
  bVar1 = Eigen::
          DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)2>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,_-1,_-1,_0,_-1,_-1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>
          ::all((DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)2>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,__1,__1,_0,__1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                 *)&local_50);
  local_611 = false;
  if (bVar1) {
    local_90 = (NestedExpressionType)
               Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::array(local_20);
    local_98 = 1.0;
    Eigen::ArrayBase<Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>::
    operator<=(&local_88,
               (ArrayBase<Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
               &local_90,&local_98);
    local_611 = Eigen::
                DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)2>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,_-1,_-1,_0,_-1,_-1>_>_>_>
                ::all((DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)2>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,__1,__1,_0,__1,__1>_>_>_>
                       *)&local_88);
  }
  if (((local_611 ^ 0xffU) & 1) == 0) {
    (*(this->super_Geometry)._vptr_Geometry[4])
              ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_2b8,this,local_20
              );
    local_2b9 = 0;
    local_2c8 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                          ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_2b8);
    i = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                  ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_2b8);
    Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<long,long>
              ((Matrix<double,_1,_1,0,_1,_1> *)__return_storage_ptr__,&local_2c8,&i);
    iVar2 = (*(this->super_Geometry)._vptr_Geometry[1])();
    if (iVar2 == 2) {
      for (jacobian.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
           m_outerStride = 0;
          IVar6 = jacobian.
                  super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                  .
                  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                  .m_outerStride,
          IVar3 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_20)
          , IVar6 < IVar3;
          jacobian.
          super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
          m_outerStride =
               jacobian.
               super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
               .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
               .m_outerStride + 1) {
        Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,int>
                  ((Type *)local_310,(DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_2b8,0,
                   jacobian.
                   super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                   .
                   super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                   .m_outerStride * 2,2,2);
        Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,int>
                  (&local_368,
                   (DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)__return_storage_ptr__,0,
                   jacobian.
                   super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                   .
                   super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                   .m_outerStride * 2,2,2);
        pSVar4 = Eigen::
                 DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_1>
                 ::operator()((DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                               *)local_310,1,1);
        Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>::
        operator<<(&local_330,
                   (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>
                    *)&local_368,pSVar4);
        pSVar4 = Eigen::
                 DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_1>
                 ::operator()((DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                               *)local_310,1,0);
        local_370 = -*pSVar4;
        pCVar5 = Eigen::
                 CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>
                 ::operator_(&local_330,&local_370);
        pSVar4 = Eigen::
                 DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_1>
                 ::operator()((DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                               *)local_310,0,1);
        local_378 = -*pSVar4;
        pCVar5 = Eigen::
                 CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>
                 ::operator_(pCVar5,&local_378);
        pSVar4 = Eigen::
                 DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_1>
                 ::operator()((DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                               *)local_310,0,0);
        Eigen::
        CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>::
        operator_(pCVar5,pSVar4);
        Eigen::
        CommaInitializer<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>::
        ~CommaInitializer(&local_330);
        local_380 = Eigen::
                    MatrixBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>
                    ::determinant((MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>
                                   *)local_310);
        Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,int>
                  ((Type *)&i_1,
                   (DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)__return_storage_ptr__,0,
                   jacobian.
                   super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                   .
                   super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                   .m_outerStride * 2,2,2);
        Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>::
        operator/=((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>
                    *)&i_1,&local_380);
      }
    }
    else {
      for (jacobian_1.
           super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
           m_outerStride = 0;
          IVar6 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_20)
          , jacobian_1.
            super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
            super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
            m_outerStride < IVar6;
          jacobian_1.
          super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
          m_outerStride =
               jacobian_1.
               super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
               .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
               .m_outerStride + 1) {
        IVar6 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                          ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_2b8);
        Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<long,int>
                  ((Type *)&A.
                            super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true,_Eigen::Dense>
                            .
                            super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true,_true>
                            .m_outerStride,
                   (DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_2b8,0,
                   jacobian_1.
                   super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                   .
                   super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                   .m_outerStride * 2,IVar6,2);
        Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>::
        col((ColXpr *)
            &B.
             super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true,_Eigen::Dense>
             .
             super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true,_true>
             .m_outerStride,
            (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_> *)
            &A.
             super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true,_Eigen::Dense>
             .
             super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true,_true>
             .m_outerStride,0);
        Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>::
        col((ColXpr *)&AB,
            (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_> *)
            &A.
             super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true,_Eigen::Dense>
             .
             super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true,_true>
             .m_outerStride,1);
        tmp.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
             (Index)Eigen::
                    MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>,-1,1,true>>
                    ::
                    dot<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,_1,1,true>>
                              ((MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,_1,1,true>>
                                *)&B.
                                   super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true,_Eigen::Dense>
                                   .
                                   super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true,_true>
                                   .m_outerStride,
                               (MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true>_>
                                *)&AB);
        local_4f0[1] = 2;
        local_4f0[0] = 2;
        Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
                  ((Matrix<double,_1,_1,0,_1,_1> *)local_4e8,local_4f0 + 1,local_4f0);
        local_518 = Eigen::
                    MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>,-1,1,true>>
                    ::
                    dot<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,_1,1,true>>
                              ((MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,_1,1,true>>
                                *)&AB,(MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true>_>
                                       *)&AB);
        Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator<<
                  (&local_510,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_4e8,
                   &local_518);
        local_520 = -(double)tmp.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                             m_storage.m_cols;
        pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                           (&local_510,&local_520);
        local_528 = -(double)tmp.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                             m_storage.m_cols;
        pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                           (pCVar7,&local_528);
        this_00 = &B.
                   super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true,_Eigen::Dense>
                   .
                   super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true,_true>
                   .m_outerStride;
        local_530 = Eigen::
                    MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>,-1,1,true>>
                    ::
                    dot<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,_1,1,true>>
                              ((MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,_1,1,true>>
                                *)this_00,
                               (MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true>_>
                                *)this_00);
        Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                  (pCVar7,&local_530);
        Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~CommaInitializer
                  (&local_510);
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>>::operator*
                  (&local_5d0,
                   (MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>> *)
                   &A.
                    super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true,_Eigen::Dense>
                    .
                    super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true,_true>
                    .m_outerStride,
                   (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_4e8);
        local_5d8 = Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::determinant
                              ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_4e8);
        Eigen::
        MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>,Eigen::Matrix<double,-1,-1,0,-1,-1>,0>>
        ::operator/(&local_590,
                    (MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
                     *)&local_5d0,&local_5d8);
        IVar6 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                          ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_2b8);
        Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<long,int>
                  (&local_610,
                   (DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)__return_storage_ptr__,0,
                   jacobian_1.
                   super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                   .
                   super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                   .m_outerStride * 2,IVar6,2);
        Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>::operator=
                  ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false> *)&local_610,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Product<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                    *)&local_590);
        Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                  ((Matrix<double,__1,__1,_0,__1,__1> *)local_4e8);
      }
    }
    local_2b9 = 1;
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
              ((Matrix<double,__1,__1,_0,__1,__1> *)local_2b8);
    return __return_storage_ptr__;
  }
  std::__cxx11::stringstream::stringstream(local_220);
  std::operator<<(local_210,"local coordinates out of bounds for reference element");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_250,"(0. <= local.array()).all() && (local.array() <= 1.).all()",
             &local_251);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_278,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/tria_o2.cc"
             ,&local_279);
  std::__cxx11::stringstream::str();
  lf::base::AssertionFailed
            (&local_250,&local_278,0x5a,
             (string *)
             &jac.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols)
  ;
  std::__cxx11::string::~string
            ((string *)
             &jac.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols)
  ;
  std::__cxx11::string::~string((string *)&local_278);
  std::allocator<char>::~allocator(&local_279);
  std::__cxx11::string::~string((string *)&local_250);
  std::allocator<char>::~allocator(&local_251);
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_01,"this code should not be reached");
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Eigen::MatrixXd TriaO2::JacobianInverseGramian(
    const Eigen::MatrixXd& local) const {
  LF_VERIFY_MSG((0. <= local.array()).all() && (local.array() <= 1.).all(),
                "local coordinates out of bounds for reference element");

  Eigen::MatrixXd jac = Jacobian(local);
  Eigen::MatrixXd jacInvGram(jac.rows(), jac.cols());

  if (DimGlobal() == 2) {
    for (long i = 0; i < local.cols(); ++i) {
      auto jacobian = jac.block(0, 2 * i, 2, 2);
      jacInvGram.block(0, 2 * i, 2, 2) << jacobian(1, 1), -jacobian(1, 0),
          -jacobian(0, 1), jacobian(0, 0);
      jacInvGram.block(0, 2 * i, 2, 2) /= jacobian.determinant();
    }
  } else {
    for (long i = 0; i < local.cols(); ++i) {
      auto jacobian = jac.block(0, 2 * i, jac.rows(), 2);

      auto A = jacobian.col(0);
      auto B = jacobian.col(1);
      auto AB = A.dot(B);

      Eigen::MatrixXd tmp(2, 2);
      tmp << B.dot(B), -AB, -AB, A.dot(A);

      jacInvGram.block(0, 2 * i, jac.rows(), 2) =
          jacobian * tmp / tmp.determinant();
    }
  }

  return jacInvGram;
}